

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O0

void __thiscall PathEscapingTortureTest::~PathEscapingTortureTest(PathEscapingTortureTest *this)

{
  PathEscapingTortureTest *this_local;
  
  ~PathEscapingTortureTest(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PathEscaping, TortureTest) {
  string result;

  GetWin32EscapedString("foo bar\\\"'$@d!st!c'\\path'\\", &result);
  EXPECT_EQ("\"foo bar\\\\\\\"'$@d!st!c'\\path'\\\\\"", result);
  result.clear();

  GetShellEscapedString("foo bar\"/'$@d!st!c'/path'", &result);
  EXPECT_EQ("'foo bar\"/'\\''$@d!st!c'\\''/path'\\'''", result);
}